

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface_p.h
# Opt level: O2

void __thiscall QWindowSystemInterfacePrivate::TouchEvent::~TouchEvent(TouchEvent *this)

{
  ~TouchEvent(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

TouchEvent(QWindow *w, ulong time, QEvent::Type t, const QPointingDevice *device,
                   const QList<QEventPoint> &p, Qt::KeyboardModifiers mods)
            : PointerEvent(w, time, Touch, mods, device), points(p), touchType(t) { }